

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O0

void __thiscall
Qentem::QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[60]>
          (QTest *this,StringStream<char16_t> *left,char16_t (*right) [60],unsigned_long line)

{
  bool bVar1;
  unsigned_long line_local;
  char16_t (*right_local) [60];
  StringStream<char16_t> *left_local;
  QTest *this_local;
  
  if ((((this->error_ & 1U) == 0) || ((this->continue_on_error_ & 1U) != 0)) &&
     (bVar1 = StringStream<char16_t>::operator!=(left,*right), bVar1)) {
    this->error_ = true;
    PrintErrorMessage<Qentem::StringStream<char16_t>,char16_t[60]>(this,false,left,right,line);
  }
  return;
}

Assistant:

QENTEM_NOINLINE void IsEqual(const Value1_T &left, const Value2_T &right, unsigned long line) {
        if ((!error_ || continue_on_error_) && (left != right)) {
            error_ = true;
            QTest::PrintErrorMessage(false, left, right, line);
        }
    }